

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O3

bool Assimp::PLY::DOM::SkipSpaces(vector<char,_std::allocator<char>_> *buffer)

{
  pointer __dest;
  pointer pcVar1;
  ulong uVar2;
  bool bVar3;
  pointer __src;
  long lVar4;
  
  __dest = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pcVar1 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (__dest == (pointer)0x0 || __dest == pcVar1) {
    bVar3 = false;
  }
  else {
    for (lVar4 = 0; uVar2 = (ulong)(byte)__dest[lVar4], uVar2 < 0x21; lVar4 = lVar4 + 1) {
      if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
          bVar3 = false;
          goto LAB_0046ee68;
        }
        break;
      }
    }
    bVar3 = true;
LAB_0046ee68:
    if (lVar4 != 0) {
      __src = __dest + lVar4;
      if (__src != pcVar1) {
        memmove(__dest,__src,(size_t)(pcVar1 + (-lVar4 - (long)__dest)));
        __src = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      }
      if (__src + -lVar4 != __src) {
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __src + -lVar4;
      }
    }
  }
  return bVar3;
}

Assistant:

bool PLY::DOM::SkipSpaces(std::vector<char> &buffer)
{
  const char* pCur = buffer.empty() ? NULL : (char*)&buffer[0];
  bool ret = false;
  if (pCur)
  {
    const char* szCur = pCur;
    ret = Assimp::SkipSpaces(pCur, &pCur);

    uintptr_t iDiff = (uintptr_t)pCur - (uintptr_t)szCur;
    buffer.erase(buffer.begin(), buffer.begin() + iDiff);
    return ret;
  }

  return ret;
}